

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable.c
# Opt level: O0

uint ares_htable_hash_FNV1a(uchar *key,size_t key_len,uint seed)

{
  ulong local_28;
  size_t i;
  uint hv;
  uint seed_local;
  size_t key_len_local;
  uchar *key_local;
  
  i._0_4_ = seed ^ 0x811c9dc5;
  for (local_28 = 0; local_28 < key_len; local_28 = local_28 + 1) {
    i._0_4_ = (key[local_28] ^ (uint)i) * 0x1000193;
  }
  return (uint)i;
}

Assistant:

unsigned int ares_htable_hash_FNV1a(const unsigned char *key, size_t key_len,
                                    unsigned int seed)
{
  unsigned int hv = seed ^ 2166136261U;
  size_t       i;

  for (i = 0; i < key_len; i++) {
    hv ^= (unsigned int)key[i];
    /* hv *= 16777619 (0x01000193) */
    hv += (hv << 1) + (hv << 4) + (hv << 7) + (hv << 8) + (hv << 24);
  }

  return hv;
}